

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::FileMonitorTask::checkArguments
          (FileMonitorTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterOrThis)

{
  pointer ppEVar1;
  size_t sVar2;
  bool bVar3;
  Type *this_00;
  long lVar4;
  MonitorVisitor visitor;
  
  this_00 = FileDisplayTask::checkArguments
                      (&this->super_FileDisplayTask,context,args,range,iterOrThis);
  bVar3 = Type::isError(this_00);
  if (!bVar3) {
    ppEVar1 = args->_M_ptr;
    sVar2 = (args->_M_extent)._M_extent_value;
    visitor.context = context;
    for (lVar4 = 8; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      Expression::visit<slang::ast::builtins::MonitorVisitor&>
                (*(Expression **)((long)ppEVar1 + lVar4),&visitor);
    }
  }
  return this_00;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = FileDisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args.subspan(1))
            arg->visit(visitor);

        return result;
    }